

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationTorque.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationTorque::IntLoadResidual_F
          (ChLinkMotorRotationTorque *this,uint off,ChVectorDynamic<> *R,double c)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  element_type *peVar14;
  ChBodyFrame *pCVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar29;
  double *pdVar30;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  undefined4 in_register_00000034;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  double dVar41;
  long in_XMM0_Qb;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ChFrame<double> aframe2;
  ChFrame<double> aframe1;
  undefined1 local_188 [16];
  long alStack_178 [2];
  undefined1 auStack_168 [16];
  double dStack_158;
  long lStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ChFrame<double> local_128;
  ChFrame<double> local_a0;
  
  auStack_168._8_8_ = auStack_168._0_8_;
  peVar14 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
            super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar41 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  dStack_158 = c;
  lStack_150 = in_XMM0_Qb;
  (*peVar14->_vptr_ChFunction[4])(peVar14,CONCAT44(in_register_00000034,off));
  auStack_168._0_8_ = dVar41;
  ChFrame<double>::operator>>
            (&local_a0,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&local_128,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar42 = ZEXT816(0) << 0x40;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auStack_168._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar46,auVar42,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  local_138 = vfmadd231sd_fma(auVar3,auVar53,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar47,auVar42,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  local_148 = vfmadd231sd_fma(auVar3,auVar53,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar48,auVar42,auVar7);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auStack_168 = vfmadd231sd_fma(auVar3,auVar53,auVar42);
  iVar28 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var,iVar28) + 0x2c) == '\0') {
    pCVar15 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body2;
    auVar49._0_8_ =
         (double)local_148._0_8_ *
         (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar49._8_8_ =
         (double)local_148._0_8_ *
         (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         (double)local_148._0_8_ *
         (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar4 = vfmadd231sd_fma(auVar43,local_138,auVar8);
    auVar54._0_8_ = local_138._0_8_;
    auVar54._8_8_ = auVar54._0_8_;
    auVar3 = vfmadd132pd_fma(auVar54,auVar49,
                             *(undefined1 (*) [16])
                              (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar50._8_8_ = auStack_168._0_8_;
    auVar50._0_8_ = auStack_168._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar4 = vfmadd231sd_fma(auVar4,auStack_168,auVar9);
    local_188 = vfmadd132pd_fma(auVar50,auVar3,
                                *(undefined1 (*) [16])
                                 ((pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.
                                  Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array + 6));
    alStack_178[0] = auVar4._0_8_;
    iVar28 = (*(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    lVar29 = (long)*(int *)(CONCAT44(extraout_var_00,iVar28) + 0x30);
    if ((lVar29 < -3) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar29 + 3)) goto LAB_005b7816;
    pdVar30 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar29 + 3;
    uVar31 = 3;
    if (((ulong)pdVar30 & 7) == 0) {
      uVar33 = -((uint)((ulong)pdVar30 >> 3) & 0x1fffffff) & 7;
      if (uVar33 < 3) {
        uVar31 = uVar33;
      }
      if (uVar33 != 0) goto LAB_005b7640;
    }
    else {
LAB_005b7640:
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dStack_158;
      auVar36 = vbroadcastsd_avx512f(auVar10);
      auVar37 = vpbroadcastq_avx512f();
      uVar34 = vpcmpuq_avx512f(auVar37,_DAT_00968140,5);
      bVar16 = (byte)uVar34;
      auVar37._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * local_188._8_8_;
      auVar37._0_8_ = (ulong)(bVar16 & 1) * local_188._0_8_;
      auVar37._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * alStack_178[0];
      auVar37._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * alStack_178[1];
      auVar37._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * auStack_168._0_8_;
      auVar37._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * auStack_168._8_8_;
      auVar37._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)dStack_158;
      auVar37._56_8_ = (uVar34 >> 7) * lStack_150;
      auVar38._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * (long)pdVar30[1];
      auVar38._0_8_ = (ulong)(bVar16 & 1) * (long)*pdVar30;
      auVar38._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * (long)pdVar30[2];
      auVar38._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * (long)pdVar30[3];
      auVar38._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * (long)pdVar30[4];
      auVar38._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * (long)pdVar30[5];
      auVar38._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)pdVar30[6];
      auVar38._56_8_ = (uVar34 >> 7) * (long)pdVar30[7];
      auVar36 = vmulpd_avx512f(auVar37,auVar36);
      auVar36 = vsubpd_avx512f(auVar38,auVar36);
      bVar17 = (bool)((byte)(uVar34 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar34 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar34 >> 3) & 1);
      bVar20 = (bool)((byte)(uVar34 >> 4) & 1);
      bVar21 = (bool)((byte)(uVar34 >> 5) & 1);
      bVar22 = (bool)((byte)(uVar34 >> 6) & 1);
      *pdVar30 = (double)((ulong)(bVar16 & 1) * auVar36._0_8_ |
                         (ulong)!(bool)(bVar16 & 1) * (long)*pdVar30);
      pdVar30[1] = (double)((ulong)bVar17 * auVar36._8_8_ | (ulong)!bVar17 * (long)pdVar30[1]);
      pdVar30[2] = (double)((ulong)bVar18 * auVar36._16_8_ | (ulong)!bVar18 * (long)pdVar30[2]);
      pdVar30[3] = (double)((ulong)bVar19 * auVar36._24_8_ | (ulong)!bVar19 * (long)pdVar30[3]);
      pdVar30[4] = (double)((ulong)bVar20 * auVar36._32_8_ | (ulong)!bVar20 * (long)pdVar30[4]);
      pdVar30[5] = (double)((ulong)bVar21 * auVar36._40_8_ | (ulong)!bVar21 * (long)pdVar30[5]);
      pdVar30[6] = (double)((ulong)bVar22 * auVar36._48_8_ | (ulong)!bVar22 * (long)pdVar30[6]);
      pdVar30[7] = (double)((uVar34 >> 7) * auVar36._56_8_ |
                           (ulong)!SUB81(uVar34 >> 7,0) * (long)pdVar30[7]);
    }
    if (uVar31 < 3) {
      uVar32 = (ulong)(uVar31 << 3);
      auVar35 = vpbroadcastq_avx512vl();
      uVar34 = vpcmpuq_avx512vl(auVar35,_DAT_00955380,5);
      uVar34 = uVar34 & 0xf;
      bVar16 = (byte)uVar34;
      plVar1 = (long *)((long)pdVar30 + uVar32);
      auVar35._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * plVar1[1];
      auVar35._0_8_ = (ulong)(bVar16 & 1) * *plVar1;
      auVar35._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * plVar1[2];
      auVar35._24_8_ = (uVar34 >> 3) * plVar1[3];
      auVar45._0_8_ = (double)((ulong)(bVar16 & 1) * *(long *)(local_188 + uVar32)) * dStack_158;
      auVar45._8_8_ =
           (double)((ulong)((byte)(uVar34 >> 1) & 1) * *(long *)(local_188 + uVar32 + 8)) *
           dStack_158;
      auVar45._16_8_ =
           (double)((ulong)((byte)(uVar34 >> 2) & 1) * *(long *)((long)alStack_178 + uVar32)) *
           dStack_158;
      auVar45._24_8_ = (double)((uVar34 >> 3) * *(long *)(auStack_168 + (uVar32 - 8))) * dStack_158;
      auVar35 = vsubpd_avx(auVar35,auVar45);
      puVar2 = (ulong *)((long)pdVar30 + uVar32);
      bVar17 = (bool)((byte)(uVar34 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar34 >> 2) & 1);
      *puVar2 = (ulong)(bVar16 & 1) * auVar35._0_8_ | (ulong)!(bool)(bVar16 & 1) * *puVar2;
      puVar2[1] = (ulong)bVar17 * auVar35._8_8_ | (ulong)!bVar17 * puVar2[1];
      puVar2[2] = (ulong)bVar18 * auVar35._16_8_ | (ulong)!bVar18 * puVar2[2];
      puVar2[3] = (uVar34 >> 3) * auVar35._24_8_ | (ulong)!SUB81(uVar34 >> 3,0) * puVar2[3];
    }
  }
  iVar28 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_01,iVar28) + 0x2c) != '\0') {
    return;
  }
  pCVar15 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body1;
  auVar51._0_8_ =
       (double)local_148._0_8_ *
       (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar51._8_8_ =
       (double)local_148._0_8_ *
       (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (double)local_148._0_8_ *
       (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar4 = vfmadd231sd_fma(auVar44,local_138,auVar11);
  auVar55._0_8_ = local_138._0_8_;
  auVar55._8_8_ = auVar55._0_8_;
  auVar3 = vfmadd132pd_fma(auVar55,auVar51,
                           *(undefined1 (*) [16])
                            (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar52._8_8_ = auStack_168._0_8_;
  auVar52._0_8_ = auStack_168._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar4 = vfmadd231sd_fma(auVar4,auStack_168,auVar12);
  local_188 = vfmadd132pd_fma(auVar52,auVar3,
                              *(undefined1 (*) [16])
                               ((pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix
                                .super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
  alStack_178[0] = auVar4._0_8_;
  iVar28 = (*(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  lVar29 = (long)*(int *)(CONCAT44(extraout_var_02,iVar28) + 0x30);
  if ((lVar29 < -3) ||
     ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
      lVar29 + 3)) {
LAB_005b7816:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar30 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
            lVar29 + 3;
  uVar31 = 3;
  if (((ulong)pdVar30 & 7) == 0) {
    uVar33 = -((uint)((ulong)pdVar30 >> 3) & 0x1fffffff) & 7;
    if (uVar33 < 3) {
      uVar31 = uVar33;
    }
    if (uVar33 == 0) goto LAB_005b77c0;
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dStack_158;
  auVar36 = vbroadcastsd_avx512f(auVar13);
  auVar37 = vpbroadcastq_avx512f();
  uVar34 = vpcmpuq_avx512f(auVar37,_DAT_00968140,5);
  bVar16 = (byte)uVar34;
  auVar39._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * local_188._8_8_;
  auVar39._0_8_ = (ulong)(bVar16 & 1) * local_188._0_8_;
  auVar39._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * alStack_178[0];
  auVar39._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * alStack_178[1];
  auVar39._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * auStack_168._0_8_;
  auVar39._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * auStack_168._8_8_;
  auVar39._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)dStack_158;
  auVar39._56_8_ = (uVar34 >> 7) * lStack_150;
  auVar40._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * (long)pdVar30[1];
  auVar40._0_8_ = (ulong)(bVar16 & 1) * (long)*pdVar30;
  auVar40._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * (long)pdVar30[2];
  auVar40._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * (long)pdVar30[3];
  auVar40._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * (long)pdVar30[4];
  auVar40._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * (long)pdVar30[5];
  auVar40._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)pdVar30[6];
  auVar40._56_8_ = (uVar34 >> 7) * (long)pdVar30[7];
  auVar36 = vmulpd_avx512f(auVar39,auVar36);
  auVar36 = vaddpd_avx512f(auVar36,auVar40);
  bVar17 = (bool)((byte)(uVar34 >> 1) & 1);
  bVar18 = (bool)((byte)(uVar34 >> 2) & 1);
  bVar19 = (bool)((byte)(uVar34 >> 3) & 1);
  bVar20 = (bool)((byte)(uVar34 >> 4) & 1);
  bVar21 = (bool)((byte)(uVar34 >> 5) & 1);
  bVar22 = (bool)((byte)(uVar34 >> 6) & 1);
  *pdVar30 = (double)((ulong)(bVar16 & 1) * auVar36._0_8_ |
                     (ulong)!(bool)(bVar16 & 1) * (long)*pdVar30);
  pdVar30[1] = (double)((ulong)bVar17 * auVar36._8_8_ | (ulong)!bVar17 * (long)pdVar30[1]);
  pdVar30[2] = (double)((ulong)bVar18 * auVar36._16_8_ | (ulong)!bVar18 * (long)pdVar30[2]);
  pdVar30[3] = (double)((ulong)bVar19 * auVar36._24_8_ | (ulong)!bVar19 * (long)pdVar30[3]);
  pdVar30[4] = (double)((ulong)bVar20 * auVar36._32_8_ | (ulong)!bVar20 * (long)pdVar30[4]);
  pdVar30[5] = (double)((ulong)bVar21 * auVar36._40_8_ | (ulong)!bVar21 * (long)pdVar30[5]);
  pdVar30[6] = (double)((ulong)bVar22 * auVar36._48_8_ | (ulong)!bVar22 * (long)pdVar30[6]);
  pdVar30[7] = (double)((uVar34 >> 7) * auVar36._56_8_ |
                       (ulong)!SUB81(uVar34 >> 7,0) * (long)pdVar30[7]);
LAB_005b77c0:
  if (uVar31 < 3) {
    uVar32 = (ulong)(uVar31 << 3);
    auVar35 = vpbroadcastq_avx512vl();
    uVar34 = vpcmpuq_avx512vl(auVar35,_DAT_00955380,5);
    uVar34 = uVar34 & 0xf;
    lVar29 = *(long *)(local_188 + uVar32 + 8);
    lVar23 = *(long *)((long)alStack_178 + uVar32);
    lVar24 = *(long *)(auStack_168 + (uVar32 - 8));
    bVar16 = (byte)uVar34;
    plVar1 = (long *)((long)pdVar30 + uVar32);
    lVar25 = plVar1[1];
    lVar26 = plVar1[2];
    lVar27 = plVar1[3];
    puVar2 = (ulong *)((long)pdVar30 + uVar32);
    bVar17 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar18 = (bool)((byte)(uVar34 >> 2) & 1);
    *puVar2 = (ulong)(bVar16 & 1) *
              (long)((double)((ulong)(bVar16 & 1) * *(long *)(local_188 + uVar32)) * dStack_158 +
                    (double)((ulong)(bVar16 & 1) * *plVar1)) | (ulong)!(bool)(bVar16 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar17 *
                (long)((double)((ulong)((byte)(uVar34 >> 1) & 1) * lVar29) * dStack_158 +
                      (double)((ulong)((byte)(uVar34 >> 1) & 1) * lVar25)) |
                (ulong)!bVar17 * puVar2[1];
    puVar2[2] = (ulong)bVar18 *
                (long)((double)((ulong)((byte)(uVar34 >> 2) & 1) * lVar23) * dStack_158 +
                      (double)((ulong)((byte)(uVar34 >> 2) & 1) * lVar26)) |
                (ulong)!bVar18 * puVar2[2];
    puVar2[3] = (uVar34 >> 3) *
                (long)((double)((uVar34 >> 3) * lVar24) * dStack_158 +
                      (double)((uVar34 >> 3) * lVar27)) | (ulong)!SUB81(uVar34 >> 3,0) * puVar2[3];
  }
  return;
}

Assistant:

void ChLinkMotorRotationTorque::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    // compute instant torque
    double mT = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_torque = aframe2.GetA() * ChVector<>(0, 0, mT);

    if (Body2->Variables().IsActive()) {
        R.segment(Body2->Variables().GetOffset() + 3, 3) -=
            c * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    }

    if (Body1->Variables().IsActive()) {
        R.segment(Body1->Variables().GetOffset() + 3, 3) +=
            c * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
    }
}